

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2l(char *cval,int *lval,int *status)

{
  double local_f8;
  double dval;
  long ival;
  char msg [81];
  char local_88 [8];
  char sval [81];
  char local_29;
  int *piStack_28;
  char dtype;
  int *status_local;
  int *lval_local;
  char *cval_local;
  
  if (*status < 1) {
    if (*cval == '\0') {
      *status = 0xcc;
      cval_local._4_4_ = 0xcc;
    }
    else {
      piStack_28 = status;
      status_local = lval;
      lval_local = (int *)cval;
      ffc2x(cval,&local_29,(long *)&dval,lval,local_88,&local_f8,status);
      if ((local_29 == 'C') || (local_29 == 'X')) {
        *piStack_28 = 0x194;
      }
      if (*piStack_28 < 1) {
        if (local_29 == 'I') {
          if (dval == 0.0) {
            *status_local = 0;
          }
          else {
            *status_local = 1;
          }
        }
        else if (local_29 == 'F') {
          if ((local_f8 != 0.0) || (NAN(local_f8))) {
            *status_local = 1;
          }
          else {
            *status_local = 0;
          }
        }
        cval_local._4_4_ = *piStack_28;
      }
      else {
        *status_local = 0;
        strcpy((char *)&ival,"Error in ffc2l evaluating string as a logical: ");
        strncat((char *)&ival,(char *)lval_local,0x1e);
        ffpmsg((char *)&ival);
        cval_local._4_4_ = *piStack_28;
      }
    }
  }
  else {
    cval_local._4_4_ = *status;
  }
  return cval_local._4_4_;
}

Assistant:

int ffc2l(const char *cval,  /* I - string representation of the value */
         int *lval,          /* O - numerical value of the input string */
         int *status)        /* IO - error status */
/*
  convert formatted string to a logical value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    long ival;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    /* convert the keyword to its native datatype */
    ffc2x(cval, &dtype, &ival, lval, sval, &dval, status);

    if (dtype == 'C' || dtype == 'X' )
        *status = BAD_LOGICALKEY;

    if (*status > 0)
    {
            *lval = 0;
            strcpy(msg,"Error in ffc2l evaluating string as a logical: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    if (dtype == 'I')
    {
        if (ival)
            *lval = 1;
        else
            *lval = 0;
    }
    else if (dtype == 'F')
    {
        if (dval)
            *lval = 1;
        else
            *lval = 0;
    }

    return(*status);
}